

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_string_utils.c
# Opt level: O0

int coda__pcre2_strcmp_8(PCRE2_SPTR8 str1,PCRE2_SPTR8 str2)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  PCRE2_UCHAR8 c2;
  byte *pbStack_20;
  PCRE2_UCHAR8 c1;
  PCRE2_SPTR8 str2_local;
  PCRE2_SPTR8 str1_local;
  
  pbStack_20 = str2;
  str2_local = str1;
  while( true ) {
    bVar3 = true;
    if (*str2_local == '\0') {
      bVar3 = *pbStack_20 != 0;
    }
    if (!bVar3) break;
    bVar1 = *str2_local;
    bVar2 = *pbStack_20;
    pbStack_20 = pbStack_20 + 1;
    str2_local = str2_local + 1;
    if (bVar1 != bVar2) {
      return (uint)(bVar2 < bVar1) * 2 + -1;
    }
  }
  return 0;
}

Assistant:

int
PRIV(strcmp)(PCRE2_SPTR str1, PCRE2_SPTR str2)
{
PCRE2_UCHAR c1, c2;
while (*str1 != '\0' || *str2 != '\0')
  {
  c1 = *str1++;
  c2 = *str2++;
  if (c1 != c2) return ((c1 > c2) << 1) - 1;
  }
return 0;
}